

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  ImVec4 *pIVar1;
  ImGuiColMod *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImGuiColMod *__dest;
  int iVar9;
  ImVec4 *pIVar10;
  int iVar11;
  
  pIVar7 = GImGui;
  pIVar10 = (GImGui->Style).Colors + idx;
  fVar3 = pIVar10->x;
  fVar4 = pIVar10->y;
  pIVar1 = (GImGui->Style).Colors + idx;
  fVar5 = pIVar1->z;
  fVar6 = pIVar1->w;
  iVar8 = (GImGui->ColorModifiers).Size;
  if (iVar8 == (GImGui->ColorModifiers).Capacity) {
    if (iVar8 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar8 / 2 + iVar8;
    }
    iVar11 = iVar8 + 1;
    if (iVar8 + 1 < iVar9) {
      iVar11 = iVar9;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (ImGuiColMod *)(*GImAllocatorAllocFunc)((long)iVar11 * 0x14,GImAllocatorUserData);
    pIVar2 = (pIVar7->ColorModifiers).Data;
    if (pIVar2 != (ImGuiColMod *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar7->ColorModifiers).Size * 0x14);
      pIVar2 = (pIVar7->ColorModifiers).Data;
      if (pIVar2 != (ImGuiColMod *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (pIVar7->ColorModifiers).Data = __dest;
    (pIVar7->ColorModifiers).Capacity = iVar11;
    iVar8 = (pIVar7->ColorModifiers).Size;
  }
  else {
    __dest = (GImGui->ColorModifiers).Data;
  }
  __dest[iVar8].Col = idx;
  pIVar1 = &__dest[iVar8].BackupValue;
  pIVar1->x = fVar3;
  pIVar1->y = fVar4;
  pIVar1->z = fVar5;
  pIVar1->w = fVar6;
  (pIVar7->ColorModifiers).Size = (pIVar7->ColorModifiers).Size + 1;
  fVar3 = col->y;
  fVar4 = col->z;
  fVar5 = col->w;
  pIVar10->x = col->x;
  pIVar10->y = fVar3;
  pIVar1 = (pIVar7->Style).Colors + idx;
  pIVar1->z = fVar4;
  pIVar1->w = fVar5;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorModifiers.push_back(backup);
    g.Style.Colors[idx] = col;
}